

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O0

void __thiscall lsim::ModelWire::merge(ModelWire *this,ModelWire *other)

{
  bool bVar1;
  reference this_00;
  pointer pMVar2;
  ModelWireJunction *pMVar3;
  Point *p0;
  Point *p1;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> __result;
  unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_> *segment;
  iterator __end1;
  iterator __begin1;
  segment_container_t *__range1;
  ModelWire *other_local;
  ModelWire *this_local;
  
  __end1 = std::
           vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
           ::begin(&other->m_segments);
  segment = (unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_> *)
            std::
            vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
            ::end(&other->m_segments);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>_>
                                *)&segment);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>_>
              ::operator*(&__end1);
    pMVar2 = std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>::
             operator->(this_00);
    pMVar3 = ModelWireSegment::junction(pMVar2,0);
    p0 = ModelWireJunction::position(pMVar3);
    pMVar2 = std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>::
             operator->(this_00);
    pMVar3 = ModelWireSegment::junction(pMVar2,1);
    p1 = ModelWireJunction::position(pMVar3);
    add_segment(this,p0,p1);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>_>
    ::operator++(&__end1);
  }
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&other->m_pins);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&other->m_pins);
  __result = std::back_inserter<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       (&this->m_pins);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::back_insert_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__last._M_current,__result);
  return;
}

Assistant:

void ModelWire::merge(ModelWire *other) {
    for (const auto &segment : other->m_segments) {
        add_segment(segment->junction(0)->position(), segment->junction(1)->position());
    } 

	std::copy(other->m_pins.begin(), other->m_pins.end(), std::back_inserter(m_pins));
}